

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O0

bool google::protobuf::util::FieldMaskUtil::ToJsonString(FieldMask *mask,string *out)

{
  bool bVar1;
  uint uVar2;
  string *this;
  string *output;
  undefined1 auVar3 [16];
  string_view input;
  string local_58 [8];
  string camelcase_path;
  string_view path;
  int i;
  string *out_local;
  FieldMask *mask_local;
  
  std::__cxx11::string::clear();
  path._M_str._4_4_ = 0;
  while( true ) {
    uVar2 = FieldMask::paths_size(mask);
    output = (string *)(ulong)uVar2;
    if ((int)uVar2 <= path._M_str._4_4_) break;
    this = FieldMask::paths_abi_cxx11_(mask,path._M_str._4_4_);
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    camelcase_path.field_2._8_8_ = auVar3._0_8_;
    std::__cxx11::string::string(local_58);
    input._M_str = (char *)local_58;
    input._M_len = auVar3._8_8_;
    bVar1 = SnakeCaseToCamelCase((FieldMaskUtil *)camelcase_path.field_2._8_8_,input,output);
    if (bVar1) {
      if (0 < path._M_str._4_4_) {
        std::__cxx11::string::push_back((char)out);
      }
      std::__cxx11::string::append((string *)out);
      bVar1 = false;
    }
    else {
      mask_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string(local_58);
    if (bVar1) goto LAB_01b546b9;
    path._M_str._4_4_ = path._M_str._4_4_ + 1;
  }
  mask_local._7_1_ = 1;
LAB_01b546b9:
  return (bool)(mask_local._7_1_ & 1);
}

Assistant:

bool FieldMaskUtil::ToJsonString(const FieldMask& mask, std::string* out) {
  out->clear();
  for (int i = 0; i < mask.paths_size(); ++i) {
    absl::string_view path = mask.paths(i);
    std::string camelcase_path;
    if (!SnakeCaseToCamelCase(path, &camelcase_path)) {
      return false;
    }
    if (i > 0) {
      out->push_back(',');
    }
    out->append(camelcase_path);
  }
  return true;
}